

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O0

void iod_read_fn(png_structp png_ptr,png_bytep data,png_size_t length)

{
  long lVar1;
  int iVar2;
  long lVar3;
  QIODevice *pQVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  long in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int nr;
  QIODevice *in;
  QPngHandlerPrivate *d;
  uchar endcrc [4];
  QImageIOHandler *in_stack_ffffffffffffffb0;
  long local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = png_get_io_ptr(in_RDI);
  pQVar4 = QImageIOHandler::device(in_stack_ffffffffffffffb0);
  local_28 = in_RDX;
  if (((*(int *)(lVar3 + 0x70) == 2) &&
      (uVar5 = (**(code **)(*(long *)pQVar4 + 0x60))(), (uVar5 & 1) == 0)) &&
     (lVar3 = (**(code **)(*(long *)pQVar4 + 0x80))(), 0 < lVar3)) {
    lVar3 = (**(code **)(*(long *)pQVar4 + 0x80))();
    lVar6 = (**(code **)(*(long *)pQVar4 + 0x78))();
    if ((lVar3 - lVar6 < 4) && (in_RDX == 4)) {
      *in_RSI = 0x826042ae;
      uVar7 = (**(code **)(*(long *)pQVar4 + 0x80))();
      (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,uVar7);
      goto LAB_009a920d;
    }
  }
  for (; local_28 != 0; local_28 = local_28 - iVar2) {
    iVar2 = QIODevice::read((char *)pQVar4,(longlong)in_RSI);
    if (iVar2 < 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_009a9225;
      png_error(in_RDI,"Read Error");
    }
  }
LAB_009a920d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_009a9225:
  __stack_chk_fail();
}

Assistant:

static
void iod_read_fn(png_structp png_ptr, png_bytep data, png_size_t length)
{
    QPngHandlerPrivate *d = (QPngHandlerPrivate *)png_get_io_ptr(png_ptr);
    QIODevice *in = d->q->device();

    if (d->state == QPngHandlerPrivate::ReadingEnd && !in->isSequential() && in->size() > 0 && (in->size() - in->pos()) < 4 && length == 4) {
        // Workaround for certain malformed PNGs that lack the final crc bytes
        uchar endcrc[4] = { 0xae, 0x42, 0x60, 0x82 };
        memcpy(data, endcrc, 4);
        in->seek(in->size());
        return;
    }

    while (length) {
        int nr = in->read((char*)data, length);
        if (nr <= 0) {
            png_error(png_ptr, "Read Error");
            return;
        }
        length -= nr;
    }
}